

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall addrman_tests::addrman_ports::test_method(addrman_ports *this)

{
  __single_object _Var1;
  bool bVar2;
  int32_t consistency_check_ratio;
  int iVar3;
  int iVar4;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  time_point tVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  readonly_property<bool> rVar8;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l;
  const_string file_01;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar9;
  assertion_result local_3e8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 local_3a8 [48];
  undefined1 auStack_378 [24];
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  __single_object addrman;
  char *local_258;
  string *local_250;
  char **local_248;
  char *local_240;
  assertion_result local_238;
  string local_220;
  direct_or_indirect local_200;
  uint local_1f0;
  Network local_1e8;
  uint32_t uStack_1e4;
  uint16_t local_1e0;
  string local_1d8;
  undefined1 local_1b8 [24];
  string ***local_1a0;
  _Prime_rehash_policy local_198;
  __node_base_ptr ap_Stack_188 [2];
  direct_or_indirect local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  uint16_t local_158;
  NodeSeconds local_150;
  __node_base_ptr p_Stack_148;
  direct_or_indirect local_138;
  undefined1 *local_128;
  string *local_120;
  uint16_t local_118;
  duration local_110;
  ServiceFlags SStack_108;
  direct_or_indirect local_f8;
  uint local_e8;
  Network local_e0;
  uint32_t uStack_dc;
  uint16_t local_d8;
  direct_or_indirect local_d0;
  uint local_c0;
  Network local_b8;
  uint32_t uStack_b4;
  uint16_t local_b0;
  direct_or_indirect local_a8;
  uint local_98;
  Network local_90;
  uint32_t uStack_8c;
  uint16_t local_88;
  direct_or_indirect local_80;
  uint local_70;
  Network local_68;
  uint32_t uStack_64;
  uint16_t local_60;
  direct_or_indirect local_58;
  uint local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio =
       GetCheckRatio((NodeContext *)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  local_178.indirect_contents.indirect = (char *)&local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,(string *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.indirect_contents.indirect != &local_168) {
    operator_delete(local_178.indirect_contents.indirect,
                    (ulong)(local_168._M_allocated_capacity + 1));
  }
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x73;
  file.m_begin = (iterator)&local_270;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_280,msg);
  local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
  local_1b8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a0 = (string ***)0xf4aea1;
  local_3e8._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                     (optional<bool>)0x0);
  local_1d8._M_dataplus._M_p = (pointer)&local_220;
  local_220._M_dataplus._M_p = (pointer)((ulong)local_220._M_dataplus._M_p._4_4_ << 0x20);
  local_3a8[0] = (assertion_result *)local_3e8._0_8_ == (assertion_result *)0x0;
  local_3a8._8_8_ = (element_type *)0x0;
  local_3a8._16_8_ = (sp_counted_base *)0x0;
  local_80.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_80._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_120 = &local_1d8;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f88;
  local_128 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_168._8_8_ = &local_d0;
  local_d0.indirect_contents.indirect = (char *)&local_3e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3a8,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xe30af9,
             (size_t)&local_80,0x73,(string *)&local_178,"0U",&local_138);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3a8 + 0x10));
  local_178.indirect_contents.indirect = (char *)&local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"250.1.1.1","");
  ResolveService((CService *)&local_80,(string *)&local_178,0x208d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.indirect_contents.indirect != &local_168) {
    operator_delete(local_178.indirect_contents.indirect,
                    (ulong)(local_168._M_allocated_capacity + 1));
  }
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x77;
  file_00.m_begin = (iterator)&local_290;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2a0,
             msg_00);
  _Var1 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_80);
  local_90 = local_68;
  uStack_8c = uStack_64;
  local_88 = local_60;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8.indirect_contents);
  local_168._8_4_ = local_90;
  local_168._12_4_ = uStack_8c;
  local_158 = local_88;
  local_150.__d.__r = (duration)100000000;
  p_Stack_148 = (__node_base_ptr)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_178;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_3a8,__l,
             (allocator_type *)&local_1d8);
  _cVar9 = 0x220892;
  bVar2 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)local_3a8,
                       (CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
  local_1b8[0] = bVar2;
  local_1b8._8_8_ = (element_type *)0x0;
  local_1b8._16_8_ = (sp_counted_base *)0x0;
  local_d0.indirect_contents.indirect = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_d0._8_8_ = (long)"addrman->Add({CAddress(addr1, NODE_NONE)}, source)" + 0x32;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_120 = (string *)&local_d0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b8,(lazy_ostream *)&local_138,1,0,WARN,_cVar9,
             (size_t)&local_2b0,0x77);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_3a8);
  if (0x10 < (uint)local_168._M_allocated_capacity._0_4_) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_98) {
    free(local_a8.indirect_contents.indirect);
    local_a8.indirect_contents.indirect = (char *)0x0;
  }
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x78;
  file_01.m_begin = (iterator)&local_2c0;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2d0,
             msg_01);
  local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
  local_1b8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a0 = (string ***)0xf4aea1;
  local_220._M_dataplus._M_p =
       (pointer)AddrMan::Size((AddrMan *)
                              addrman._M_t.
                              super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                              super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                              super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                              (optional<Network>)0x0,(optional<bool>)0x0);
  local_3e8._0_8_ = &local_238;
  local_238._0_4_ = 1;
  local_3a8[0] = local_220._M_dataplus._M_p == (pointer)0x1;
  local_3a8._8_8_ = (element_type *)0x0;
  local_3a8._16_8_ = (sp_counted_base *)0x0;
  local_d0.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_d0._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_1d8._M_dataplus._M_p = (pointer)&local_220;
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f88;
  local_128 = boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_168._8_8_ = &local_1d8;
  local_120 = (string *)&local_3e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3a8,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xe30af9,
             (size_t)&local_d0,0x78,(iterator)&local_178,"1U",(lazy_ostream *)&local_138);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3a8 + 0x10));
  local_178.indirect_contents.indirect = (char *)&local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"250.1.1.1","");
  ResolveService((CService *)&local_d0,(string *)&local_178,0x208e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.indirect_contents.indirect != &local_168) {
    operator_delete(local_178.indirect_contents.indirect,
                    (ulong)(local_168._M_allocated_capacity + 1));
  }
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x7b;
  file_02.m_begin = (iterator)&local_2e0;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f0,
             msg_02);
  _Var1 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0);
  local_e0 = local_b8;
  uStack_dc = uStack_b4;
  local_d8 = local_b0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8.indirect_contents);
  local_168._8_4_ = local_e0;
  local_168._12_4_ = uStack_dc;
  local_158 = local_d8;
  local_150.__d.__r = (duration)100000000;
  p_Stack_148 = (__node_base_ptr)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_178;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_3a8,__l_00,
             (allocator_type *)&local_3e8);
  _cVar9 = 0x220c2e;
  bVar2 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)local_3a8,
                       (CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
  local_1b8[0] = bVar2;
  local_1b8._8_8_ = (element_type *)0x0;
  local_1b8._16_8_ = (sp_counted_base *)0x0;
  local_1d8._M_dataplus._M_p = "addrman->Add({CAddress(addr1_port, NODE_NONE)}, source)";
  local_1d8._M_string_length = 0xe30ca6;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_120 = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b8,(lazy_ostream *)&local_138,1,0,WARN,_cVar9,
             (size_t)&local_300,0x7b);
  boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 0x10));
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_3a8);
  if (0x10 < (uint)local_168._M_allocated_capacity._0_4_) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_e8) {
    free(local_f8.indirect_contents.indirect);
    local_f8.indirect_contents.indirect = (char *)0x0;
  }
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x7c;
  file_03.m_begin = (iterator)&local_310;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_320,
             msg_03);
  local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
  local_1b8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a0 = (string ***)0xf4aea1;
  local_238._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                     (optional<bool>)0x0);
  local_220._M_dataplus._M_p = (pointer)&local_248;
  local_248 = (char **)CONCAT44(local_248._4_4_,2);
  local_3a8[0] = (string **)local_238._0_8_ == (string **)0x2;
  local_3a8._8_8_ = (element_type *)0x0;
  local_3a8._16_8_ = (sp_counted_base *)0x0;
  local_1d8._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1d8._M_string_length = 0xe30adf;
  local_3e8._0_8_ = &local_238;
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f88;
  local_128 = boost::unit_test::lazy_ostream::inst;
  local_120 = &local_220;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_168._8_8_ = &local_3e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3a8,(lazy_ostream *)local_1b8,1,2,REQUIRE,0xe30af9,
             (size_t)&local_1d8,0x7c,(iterator)&local_178,"2U",(lazy_ostream *)&local_138);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3a8 + 0x10));
  local_1b8._0_8_ = ap_Stack_188;
  local_1b8._8_8_ = (element_type *)0x1;
  local_1b8._16_8_ = (sp_counted_base *)0x0;
  local_1a0 = (string ***)0x0;
  local_198._M_max_load_factor = 1.0;
  local_198._4_4_ = 0;
  local_198._M_next_resize = 0;
  ap_Stack_188[0] = (__node_base_ptr)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_178,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,false,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)local_1b8);
  local_138._9_7_ = local_178._9_7_;
  local_138._8_1_ = (bool)local_178.direct[8];
  local_138.indirect_contents.indirect = local_178.indirect_contents.indirect;
  local_128 = (undefined1 *)CONCAT44(local_128._4_4_,local_168._M_allocated_capacity._0_4_);
  local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffff00000000;
  local_120 = (string *)local_168._8_8_;
  local_118 = local_158;
  local_110 = local_150.__d.__r;
  SStack_108 = (ServiceFlags)p_Stack_148;
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_1b8);
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x7e;
  file_04.m_begin = (iterator)&local_330;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_340,
             msg_04);
  CService::ToStringAddrPort_abi_cxx11_((string *)&local_178,(CService *)&local_138);
  _cVar9 = 0x220f9d;
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178
                     ,"250.1.1.1:8333");
  if (iVar3 == 0) {
    rVar8.super_class_property<bool>.value = (class_property<bool>)true;
  }
  else {
    CService::ToStringAddrPort_abi_cxx11_(&local_1d8,(CService *)&local_138);
    _cVar9 = 0x220fcf;
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_1d8,"250.1.1.1:8334");
    rVar8.super_class_property<bool>.value = (class_property<bool>)(iVar4 == 0);
  }
  local_3a8[0] = rVar8.super_class_property<bool>.value;
  local_3a8._8_8_ = (element_type *)0x0;
  local_3a8._16_8_ = (sp_counted_base *)0x0;
  local_3e8._0_8_ =
       "addr_ret2.ToStringAddrPort() == \"250.1.1.1:8333\" || addr_ret2.ToStringAddrPort() == \"250.1.1.1:8334\""
  ;
  local_3e8.m_message.px = (element_type *)0xe30d1a;
  local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
  local_1b8._0_8_ = &PTR__lazy_ostream_01389048;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_348 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_1a0 = (string ***)&local_3e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3a8,(lazy_ostream *)local_1b8,1,0,WARN,_cVar9,
             (size_t)&local_350,0x7e);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3a8 + 0x10));
  if ((iVar3 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2)) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.indirect_contents.indirect != &local_168) {
    operator_delete(local_178.indirect_contents.indirect,
                    (ulong)(local_168._M_allocated_capacity + 1));
  }
  _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_200.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0);
  local_1e8 = local_b8;
  uStack_1e4 = uStack_b4;
  local_1e0 = local_b0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_200.indirect_contents);
  local_168._8_4_ = local_1e8;
  local_168._12_4_ = uStack_1e4;
  local_158 = local_1e0;
  local_150.__d.__r = (duration)100000000;
  p_Stack_148 = (__node_base_ptr)0x0;
  tVar5 = NodeClock::now();
  AddrMan::Good((AddrMan *)
                _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)&local_178,
                (NodeSeconds)((long)tVar5.__d.__r / 1000000000));
  if (0x10 < (uint)local_168._M_allocated_capacity._0_4_) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_1f0) {
    free(local_200.indirect_contents.indirect);
    local_200.indirect_contents.indirect = (char *)0x0;
  }
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_358 = "";
  auStack_378._8_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  auStack_378._16_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x83;
  file_05.m_begin = (iterator)&local_360;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
             (size_t)(auStack_378 + 8),msg_05);
  local_3a8._8_8_ = local_3a8._8_8_ & 0xffffffffffffff00;
  local_3a8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_3a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8._24_8_ = "";
  local_250 = (string *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_248 = &local_258;
  local_258 = (char *)CONCAT44(local_258._4_4_,2);
  local_3e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_250 == (string *)0x2);
  local_3e8.m_message.px = (element_type *)0x0;
  local_3e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_220._M_string_length = 0xe30adf;
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_168._8_8_ = &local_238;
  local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
  local_1b8._0_8_ = &PTR__lazy_ostream_01388f88;
  local_1b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a0 = (string ***)&local_248;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_238._0_8_ = &local_250;
  boost::test_tools::tt_detail::report_assertion
            (&local_3e8,(lazy_ostream *)local_3a8,1,2,REQUIRE,0xe30af9,(size_t)&local_220,0x83,
             (CService *)&local_178,"2U",(lazy_ostream *)local_1b8);
  boost::detail::shared_count::~shared_count(&local_3e8.m_message.pn);
  local_3a8._0_8_ = auStack_378;
  local_3a8._8_8_ = (element_type *)0x1;
  local_3a8._16_8_ = (sp_counted_base *)0x0;
  local_3a8._24_8_ = 0;
  local_3a8._32_8_ = 0x3f800000;
  local_3a8._40_8_ = 0;
  auStack_378._0_8_ = (char *)0x0;
  AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                   *)&local_178,
                  (AddrMan *)
                  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,true,
                  (unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *)local_3a8);
  local_1b8._8_8_ = CONCAT71(local_178._9_7_,local_178.direct[8]);
  local_1b8._0_8_ = local_178.indirect_contents.indirect;
  local_1b8._16_4_ = local_168._M_allocated_capacity._0_4_;
  local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffff00000000;
  local_1a0 = (string ***)local_168._8_8_;
  local_198._M_max_load_factor._0_2_ = local_158;
  local_198._M_next_resize = (size_t)local_150.__d.__r;
  ap_Stack_188[0] = p_Stack_148;
  std::
  _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_3a8);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x86;
  file_06.m_begin = (iterator)&local_3b8;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3c8,
             msg_06);
  local_3e8.m_message.px = (element_type *)((ulong)local_3e8.m_message.px & 0xffffffffffffff00);
  local_3e8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_3e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3d0 = "";
  CService::ToStringAddrPort_abi_cxx11_(&local_220,(CService *)local_1b8);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_220,"250.1.1.1:8333");
  local_238.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar3 == 0);
  local_238.m_message.px = (element_type *)0x0;
  local_238.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_248 = (char **)0xe30a79;
  local_240 = "";
  local_178.direct[8] = '\0';
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388fc8;
  local_168._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_258 = "250.1.1.1:8333";
  local_3a8._8_8_ = local_3a8._8_8_ & 0xffffffffffffff00;
  local_3a8._0_8_ = &PTR__lazy_ostream_01389088;
  local_3a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3a8._24_8_ = &local_258;
  local_250 = &local_220;
  local_168._8_8_ = &local_250;
  boost::test_tools::tt_detail::report_assertion
            (&local_238,(lazy_ostream *)&local_3e8,1,2,REQUIRE,0xe30d1b,(size_t)&local_248,0x86,
             (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)&local_178,"\"250.1.1.1:8333\"",
             (_Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_3a8);
  boost::detail::shared_count::~shared_count(&local_238.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (0x10 < (uint)local_1b8._16_4_) {
    free((void *)local_1b8._0_8_);
  }
  if (0x10 < (uint)local_128) {
    free(local_138.indirect_contents.indirect);
  }
  if (0x10 < local_c0) {
    free(local_d0.indirect_contents.indirect);
  }
  if (0x10 < local_70) {
    free(local_80.indirect_contents.indirect);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_ports)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    BOOST_CHECK_EQUAL(addrman->Size(), 0U);

    // Test 7; Addr with same IP but diff port does not replace existing addr.
    CService addr1 = ResolveService("250.1.1.1", 8333);
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    CService addr1_port = ResolveService("250.1.1.1", 8334);
    BOOST_CHECK(addrman->Add({CAddress(addr1_port, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 2U);
    auto addr_ret2 = addrman->Select().first;
    BOOST_CHECK(addr_ret2.ToStringAddrPort() == "250.1.1.1:8333" || addr_ret2.ToStringAddrPort() == "250.1.1.1:8334");

    // Test: Add same IP but diff port to tried table; this converts the entry with
    // the specified port to tried, but not the other.
    addrman->Good(CAddress(addr1_port, NODE_NONE));
    BOOST_CHECK_EQUAL(addrman->Size(), 2U);
    bool new_only = true;
    auto addr_ret3 = addrman->Select(new_only).first;
    BOOST_CHECK_EQUAL(addr_ret3.ToStringAddrPort(), "250.1.1.1:8333");
}